

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

void __thiscall FunctionTable::GetCurrentTermTopLabel(FunctionTable *this,string *top_label)

{
  string local_30 [32];
  
  std::__cxx11::string::string
            (local_30,(string *)
                      &(this->m_func_table).
                       super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>.
                       _M_impl.super__Vector_impl_data._M_start[this->m_current_term_ptr].
                       m_top_label);
  std::__cxx11::string::operator=((string *)top_label,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void FunctionTable::GetCurrentTermTopLabel(string& top_label) const {
    top_label = m_func_table[m_current_term_ptr].GetTopLabel();
}